

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmCommonTargetGenerator::AppendFortranFormatFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar2;
  FortranFormat FVar3;
  char *pcVar4;
  allocator<char> local_41;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Fortran_FORMAT","");
  pcVar4 = cmSourceFile::GetProperty(source,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  FVar3 = cmOutputConverter::GetFortranFormat(pcVar4);
  if (FVar3 == FortranFormatNone) {
    this_00 = this->GeneratorTarget;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Fortran_FORMAT","");
    pcVar4 = cmGeneratorTarget::GetProperty(this_00,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    FVar3 = cmOutputConverter::GetFortranFormat(pcVar4);
  }
  if (FVar3 == FortranFormatFixed) {
    pcVar4 = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
  }
  else {
    if (FVar3 != FortranFormatFree) {
      return;
    }
    pcVar4 = "CMAKE_Fortran_FORMAT_FREE_FLAG";
  }
  this_01 = this->Makefile;
  pcVar2 = this->LocalCommonGenerator;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar4,&local_41);
  pcVar4 = cmMakefile::GetDefinition(this_01,&local_40);
  (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[7])(pcVar2,flags,pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranFormatFlags(
  std::string& flags, cmSourceFile const& source)
{
  const char* srcfmt = source.GetProperty("Fortran_FORMAT");
  cmOutputConverter::FortranFormat format =
    cmOutputConverter::GetFortranFormat(srcfmt);
  if (format == cmOutputConverter::FortranFormatNone) {
    const char* tgtfmt = this->GeneratorTarget->GetProperty("Fortran_FORMAT");
    format = cmOutputConverter::GetFortranFormat(tgtfmt);
  }
  const char* var = nullptr;
  switch (format) {
    case cmOutputConverter::FortranFormatFixed:
      var = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
      break;
    case cmOutputConverter::FortranFormatFree:
      var = "CMAKE_Fortran_FORMAT_FREE_FLAG";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendFlags(
      flags, this->Makefile->GetDefinition(var));
  }
}